

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void am_set_commands_into_script_window(Am_Object *script_window,Am_Object *execute_command)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *pvVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  Am_Object local_70;
  Am_Object counter;
  Am_Object local_60;
  Am_Object local_58;
  undefined1 local_50 [8];
  Am_Value_List menu_commands;
  Am_Object cmd;
  undefined1 local_28 [8];
  Am_Value_List cmd_list;
  Am_Object *execute_command_local;
  Am_Object *script_window_local;
  
  cmd_list.item = (Am_List_Item *)execute_command;
  pAVar2 = Am_Object::Get(execute_command,Am_COMMANDS_PROTOTYPES,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_28,pAVar2);
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Adding commands ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)local_28);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = operator<<(poVar3,script_window);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  }
  Am_Object::Am_Object((Am_Object *)&menu_commands.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_50);
  Am_Value_List::Start((Am_Value_List *)local_28);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_28);
    Am_Object::operator=((Am_Object *)&menu_commands.item,pAVar2);
    am_gen_one_script_line(&local_58);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
    Am_Value_List::Add((Am_Value_List *)local_50,pAVar5,Am_TAIL,true);
    Am_Object::~Am_Object(&local_58);
    Am_Value_List::Next((Am_Value_List *)local_28);
  }
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"setting ");
    Am_Object::Get_Object(&local_60,(Am_Slot_Key)script_window,(ulong)Am_UNDO_SCROLL_GROUP);
    poVar3 = operator<<(poVar3,&local_60);
    poVar3 = std::operator<<(poVar3," value to ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)local_50);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    Am_Object::~Am_Object(&local_60);
  }
  Am_Object::Get_Object(&counter,(Am_Slot_Key)script_window,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_50);
  pAVar6 = Am_Object::Set(&counter,0xa2,pAVar5,0);
  pAVar6 = Am_Object::Set(pAVar6,0x169,0,0);
  Am_Object::Set(pAVar6,0x171,0,1);
  Am_Object::~Am_Object(&counter);
  pAVar2 = Am_Object::Get(script_window,Am_EXECUTE_COUNTER,3);
  Am_Object::Am_Object(&local_70,pAVar2);
  bVar1 = Am_Object::Valid(&local_70);
  if (bVar1) {
    Am_Object::Set(&local_70,0x169,1,0);
  }
  Am_Object::~Am_Object(&local_70);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
  Am_Object::~Am_Object((Am_Object *)&menu_commands.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_28);
  return;
}

Assistant:

void
am_set_commands_into_script_window(Am_Object &script_window,
                                   Am_Object &execute_command)
{
  Am_Value_List cmd_list = execute_command.Get(Am_COMMANDS_PROTOTYPES);
  if (am_sdebug)
    std::cout << "Adding commands " << cmd_list << " to " << script_window
              << std::endl
              << std::flush;
  Am_Object cmd;
  Am_Value_List menu_commands;

  for (cmd_list.Start(); !cmd_list.Last(); cmd_list.Next()) {
    cmd = cmd_list.Get();
    menu_commands.Add(am_gen_one_script_line(cmd));
  }
  if (am_sdebug)
    std::cout << "setting " << script_window.Get_Object(Am_UNDO_SCROLL_GROUP)
              << " value to " << menu_commands << std::endl
              << std::flush;
  script_window.Get_Object(Am_UNDO_SCROLL_GROUP)
      .Set(Am_ITEMS, menu_commands)
      //so nothing selected
      .Set(Am_VALUE, (0L))
      //so nothing yellow or green selected
      .Set(Am_SAVED_OLD_OBJECT_OWNER, (0L), Am_OK_IF_NOT_THERE);
  Am_Object counter =
      script_window.Get(Am_EXECUTE_COUNTER, Am_RETURN_ZERO_ON_ERROR);
  if (counter.Valid())
    counter.Set(Am_VALUE, 1);
}